

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void FromWabtValues(Store *store,wasm_val_vec_t *values,ValueTypes *types,Values *wabt_values)

{
  u64 *puVar1;
  wasm_val_t *pwVar2;
  pointer pTVar3;
  pointer pTVar4;
  size_t sVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  wasm_val_t wVar8;
  TypedValue local_48;
  
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar5 = (long)pTVar4 - (long)pTVar3 >> 3;
  if (sVar5 != (long)(wabt_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(wabt_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 4) {
    __assert_fail("types.size() == wabt_values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1f2,
                  "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
                 );
  }
  if (sVar5 == values->size) {
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < (ulong)((long)pTVar4 - (long)pTVar3 >> 3); uVar7 = uVar7 + 1) {
      local_48.type = pTVar3[uVar7];
      puVar1 = (u64 *)((long)&((wabt_values->
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar6);
      local_48.value.field_0.i64_ = *puVar1;
      local_48.value.field_0._8_8_ = puVar1[1];
      wVar8 = FromWabtValue(store,&local_48);
      pwVar2 = values->data;
      (&pwVar2->kind)[lVar6] = wVar8.kind;
      ((anon_union_8_5_30786955_for_of *)((long)&pwVar2->of + lVar6))->i64 = (int64_t)wVar8.of;
      pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x10;
    }
    return;
  }
  __assert_fail("types.size() == values->size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,499,
                "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
               );
}

Assistant:

static void FromWabtValues(Store& store,
                           wasm_val_vec_t* values,
                           const ValueTypes& types,
                           const Values& wabt_values) {
  assert(types.size() == wabt_values.size());
  assert(types.size() == values->size);
  for (size_t i = 0; i < types.size(); ++i) {
    values->data[i] =
        FromWabtValue(store, TypedValue{types[i], wabt_values[i]});
  }
}